

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateServiceDefinitions
          (FileGenerator *this,Printer *printer)

{
  bool bVar1;
  pointer ppSVar2;
  int i;
  ulong uVar3;
  
  bVar1 = HasGenericServices(this->file_,&this->options_);
  if (bVar1) {
    for (uVar3 = 0;
        ppSVar2 = (this->service_generators_).
                  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->service_generators_).
                              super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3);
        uVar3 = uVar3 + 1) {
      if (uVar3 != 0) {
        io::Printer::Print(printer,"\n");
        io::Printer::Print(printer,
                           "// -------------------------------------------------------------------\n"
                          );
        io::Printer::Print(printer,"\n");
        ppSVar2 = (this->service_generators_).
                  super__Vector_base<google::protobuf::compiler::cpp::ServiceGenerator_*,_std::allocator<google::protobuf::compiler::cpp::ServiceGenerator_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      ServiceGenerator::GenerateDeclarations(ppSVar2[uVar3],printer);
    }
    io::Printer::Print(printer,"\n");
    io::Printer::Print(printer,
                       "// ===================================================================\n");
    io::Printer::Print(printer,"\n");
    return;
  }
  return;
}

Assistant:

void FileGenerator::GenerateServiceDefinitions(io::Printer* printer) {
  if (HasGenericServices(file_, options_)) {
    // Generate service definitions.
    for (int i = 0; i < service_generators_.size(); i++) {
      if (i > 0) {
        printer->Print("\n");
        printer->Print(kThinSeparator);
        printer->Print("\n");
      }
      service_generators_[i]->GenerateDeclarations(printer);
    }

    printer->Print("\n");
    printer->Print(kThickSeparator);
    printer->Print("\n");
  }
}